

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O2

void __thiscall midi_container::split_by_instrument_changes(midi_container *this,split_callback cb)

{
  vector<midi_track,_std::allocator<midi_track>_> *this_00;
  midi_event *p_event;
  pointer pmVar1;
  pointer pmVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  midi_track *this_01;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  long lVar13;
  bool bVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  midi_track program_change;
  midi_track output_track;
  midi_track source_track;
  string name;
  undefined1 local_78 [16];
  pointer local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  
  if (this->m_form == 1) {
    pmVar1 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pmVar2 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = &this->m_tracks;
    for (lVar3 = 0; lVar3 != ((long)pmVar1 - (long)pmVar2) / 0x18; lVar3 = lVar3 + 1) {
      midi_track::midi_track
                (&source_track,
                 (this_00->super__Vector_base<midi_track,_std::allocator<midi_track>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      std::vector<midi_track,_std::allocator<midi_track>_>::erase
                (this_00,(this_00->super__Vector_base<midi_track,_std::allocator<midi_track>_>).
                         _M_impl.super__Vector_impl_data._M_start);
      output_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      output_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      output_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      program_change.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      program_change.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      program_change.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar6 = (long)source_track.m_events.
                    super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)source_track.m_events.
                    super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                    super__Vector_impl_data._M_start;
      for (lVar13 = 0; lVar13 != lVar6 >> 6; lVar13 = lVar13 + 1) {
        p_event = source_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar13;
        this_01 = &program_change;
        if ((source_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar13].m_type != program_change) &&
           (((source_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar13].m_type != control_change ||
             ((p_event->m_data[0] & 0xdf) != 0)) &&
            (this_01 = &output_track,
            program_change.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            program_change.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
            _M_impl.super__Vector_impl_data._M_start)))) {
          if (output_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              output_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            std::vector<midi_track,_std::allocator<midi_track>_>::push_back(this_00,&output_track);
          }
          std::vector<midi_event,_std::allocator<midi_event>_>::operator=
                    (&output_track.m_events,&program_change.m_events);
          if (cb != (split_callback)0x0) {
            uVar4 = (ulong)((long)program_change.m_events.
                                  super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)program_change.m_events.
                                 super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 6;
            uVar7 = 0;
            uVar5 = uVar4 & 0xffffffff;
            if ((int)uVar4 < 1) {
              uVar5 = uVar7;
            }
            uVar12 = '\0';
            uVar4 = 0;
            uVar8 = '\0';
            uVar10 = '\0';
            for (; uVar5 * 0x40 != uVar7; uVar7 = uVar7 + 0x40) {
              uVar9 = (program_change.m_events.
                       super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                       super__Vector_impl_data._M_start)->m_data[uVar7];
              uVar11 = uVar10;
              if ((*(int *)((program_change.m_events.
                             super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                             super__Vector_impl_data._M_start)->m_data + (uVar7 - 0x10)) != 4) &&
                 (bVar14 = uVar9 != '\0', uVar9 = uVar8,
                 uVar11 = (program_change.m_events.
                           super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                           super__Vector_impl_data._M_start)->m_data[uVar7 + 1], bVar14)) {
                uVar11 = uVar10;
                uVar12 = (program_change.m_events.
                          super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_data[uVar7 + 1];
              }
              if (uVar4 < *(ulong *)((program_change.m_events.
                                      super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->m_data +
                                    (uVar7 - 0x18))) {
                uVar4 = *(ulong *)((program_change.m_events.
                                    super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->m_data +
                                  (uVar7 - 0x18));
              }
              uVar8 = uVar9;
              uVar10 = uVar11;
            }
            (*cb)(&name,uVar10,uVar12,uVar8);
            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&data,name._M_string_length + 2);
            *data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start = 0xff;
            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[1] = '\x03';
            std::
            __copy_move_a<false,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )name._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(name._M_dataplus._M_p + name._M_string_length),
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + 2));
            midi_event::midi_event
                      ((midi_event *)local_78,uVar4,extended,0,
                       data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
            midi_track::add_event(&output_track,(midi_event *)local_78);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_50);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            std::__cxx11::string::~string((string *)&name);
          }
          local_78._0_8_ = (pointer)0x0;
          local_78._8_8_ = (pointer)0x0;
          local_68 = (pointer)0x0;
          std::vector<midi_event,_std::allocator<midi_event>_>::operator=
                    (&program_change.m_events,
                     (vector<midi_event,_std::allocator<midi_event>_> *)local_78);
          std::vector<midi_event,_std::allocator<midi_event>_>::~vector
                    ((vector<midi_event,_std::allocator<midi_event>_> *)local_78);
        }
        midi_track::add_event(this_01,p_event);
      }
      if (output_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          output_track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<midi_track,_std::allocator<midi_track>_>::push_back(this_00,&output_track);
      }
      std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&program_change.m_events);
      std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&output_track.m_events);
      std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&source_track.m_events);
    }
  }
  return;
}

Assistant:

void midi_container::split_by_instrument_changes(split_callback cb)
{
    if (m_form != 1) /* This would literally die on anything else */
        return;

    for (unsigned long i = 0, j = m_tracks.size(); i < j; ++i)
    {
        midi_track source_track = m_tracks[0];

        m_tracks.erase(m_tracks.begin());

        midi_track output_track;
        midi_track program_change;

        for (unsigned long k = 0, l = source_track.get_count(); k < l; ++k)
        {
            const midi_event & event = source_track[ k ];
            if ( event.m_type == midi_event::program_change ||
               ( event.m_type == midi_event::control_change &&
                 (event.m_data[0] == 0 || event.m_data[0] == 0x20)))
            {
                program_change.add_event( event );
            }
            else
            {
                if (program_change.get_count())
                {
                    if (output_track.get_count())
                        m_tracks.push_back( output_track );
                    output_track = program_change;
					if (cb)
					{
						unsigned long timestamp = 0;
						uint8_t bank_msb = 0, bank_lsb = 0, instrument = 0;
						for (int i = 0, j = program_change.get_count(); i < j; ++i)
						{
							const midi_event & ev = program_change[i];
							if (ev.m_type == midi_event::program_change)
								instrument = ev.m_data[0];
							else if (ev.m_data[0] == 0)
								bank_msb = ev.m_data[1];
							else
								bank_lsb = ev.m_data[1];
							if (ev.m_timestamp > timestamp)
								timestamp = ev.m_timestamp;
						}

						std::string name = cb(bank_msb, bank_lsb, instrument);

						std::vector<uint8_t> data;

						data.resize(name.length() + 2);

						data[0] = 0xFF;
						data[1] = 0x03;

						std::copy(name.begin(), name.end(), data.begin() + 2);

						output_track.add_event(midi_event(timestamp, midi_event::extended, 0, &data[0], data.size()));
					}
					program_change = midi_track();
                }
                output_track.add_event( event );
            }
        }

        if (output_track.get_count())
            m_tracks.push_back(output_track);
    }
}